

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OBJFileReader.cpp
# Opt level: O3

void __thiscall MeshLib::OBJFileReader::~OBJFileReader(OBJFileReader *this)

{
  Point **ppPVar1;
  Point *pPVar2;
  int iVar3;
  
  if (0 < (this->tArray).m_nSize) {
    iVar3 = 0;
    do {
      pPVar2 = Array<MeshLib::Point>::GetAt(&this->tArray,iVar3);
      if (pPVar2 != (Point *)0x0) {
        operator_delete(pPVar2);
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 < (this->tArray).m_nSize);
  }
  if (0 < (this->nArray).m_nSize) {
    iVar3 = 0;
    do {
      pPVar2 = Array<MeshLib::Point>::GetAt(&this->nArray,iVar3);
      if (pPVar2 != (Point *)0x0) {
        operator_delete(pPVar2);
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 < (this->nArray).m_nSize);
  }
  ppPVar1 = (this->nArray).m_pData;
  if (ppPVar1 != (Point **)0x0) {
    operator_delete__(ppPVar1);
  }
  ppPVar1 = (this->tArray).m_pData;
  if (ppPVar1 != (Point **)0x0) {
    operator_delete__(ppPVar1);
    return;
  }
  return;
}

Assistant:

OBJFileReader::~OBJFileReader() {
	for(int i = 0; i< tArray.GetSize(); i++) {
		Point * p = tArray.GetAt(i);
		if( p != NULL)
			delete p;
	}

	for(int k = 0; k< nArray.GetSize(); k++) {
		Point * p = nArray.GetAt(k);
		if( p != NULL)
			delete p;
	}
}